

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O2

void * OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk,void *p)

{
  size_t where;
  void *pvVar1;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    for (where = 0; sk->num != where; where = where + 1) {
      if (sk->data[where] == p) {
        pvVar1 = OPENSSL_sk_delete(sk,where);
        return pvVar1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *OPENSSL_sk_delete_ptr(OPENSSL_STACK *sk, const void *p) {
  if (sk == NULL) {
    return NULL;
  }

  for (size_t i = 0; i < sk->num; i++) {
    if (sk->data[i] == p) {
      return OPENSSL_sk_delete(sk, i);
    }
  }

  return NULL;
}